

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

bool __thiscall ADSBHubConnection::StreamProcessDataVRSLine(ADSBHubConnection *this,uint8_t *pStart)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  long lVar6;
  bool bVar7;
  int ln;
  char *szMsg;
  float *pfVar8;
  float *local_80;
  FDKeyTy key;
  string local_48;
  
  bVar2 = *pStart;
  if (bVar2 < 10) {
    if (0 < (int)dataRefs.iLogLevel) {
      return false;
    }
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
           ,0x207,"StreamProcessDataVRSLine",logDEBUG,"Ignoring too short a message of length %d",
           (ulong)bVar2);
    return false;
  }
  LTFlightData::FDKeyTy::FDKeyTy
            (&key,KEY_ICAO,
             (ulong)pStart[6] | (ulong)((uint)pStart[5] << 8 | (uint)pStart[4] << 0x10));
  if (((this->fdKey).eKeyType != key.eKeyType) || ((this->fdKey).num != key.num)) {
    ProcessPlaneData(this);
    LTFlightData::FDKeyTy::operator=(&this->fdKey,&key);
  }
  pfVar8 = (float *)(pStart + (uint)bVar2);
  bVar2 = pStart[7];
  bVar3 = pStart[8];
  local_80 = (float *)(pStart + 9);
  if ((bVar2 & 1) == 0) {
LAB_0014053d:
    if ((bVar2 & 2) != 0) {
      if (pfVar8 < (float *)((long)local_80 + 2)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_001407c2;
        szMsg = "Line too short for next value Altitude";
        ln = 0x22d;
        goto LAB_001407a6;
      }
      lVar6 = VRSFloatInt((uint8_t **)&local_80);
      (this->pos)._alt = (double)lVar6 * 0.3048;
    }
    if ((bVar2 & 4) != 0) {
      if (pfVar8 < (float *)((long)local_80 + 1U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_001407c2;
        szMsg = "Line too short for next value Ground Speed";
        ln = 0x233;
        goto LAB_001407a6;
      }
      sVar4 = *(short *)local_80;
      local_80 = (float *)((long)local_80 + 2);
      (this->dyn).spd = (double)(int)sVar4;
    }
    if ((bVar2 & 8) != 0) {
      if (pfVar8 < (float *)((long)local_80 + 1U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_001407c2;
        szMsg = "Line too short for next value Track";
        ln = 0x239;
        goto LAB_001407a6;
      }
      sVar4 = *(short *)local_80;
      local_80 = (float *)((long)local_80 + 2);
      (this->dyn).heading = (double)(int)sVar4 / 10.0;
      (this->pos)._head = (double)(int)sVar4 / 10.0;
    }
    if ((bVar2 & 0x10) != 0) {
      if (pfVar8 < (float *)((long)local_80 + 3U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_001407c2;
        szMsg = "Line too short for next value Latitude";
        ln = 0x23f;
        goto LAB_001407a6;
      }
      fVar1 = *local_80;
      local_80 = local_80 + 1;
      (this->pos)._lat = (double)fVar1;
    }
    if ((bVar2 & 0x20) != 0) {
      if (pfVar8 < (float *)((long)local_80 + 3U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_001407c2;
        szMsg = "Line too short for next value Longitude";
        ln = 0x245;
        goto LAB_001407a6;
      }
      fVar1 = *local_80;
      local_80 = local_80 + 1;
      (this->pos)._lon = (double)fVar1;
    }
    if ((bVar2 & 0x40) != 0) {
      if (pfVar8 < (float *)((long)local_80 + 1U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_001407c2;
        szMsg = "Line too short for next value VSI";
        ln = 0x24b;
        goto LAB_001407a6;
      }
      sVar4 = *(short *)local_80;
      local_80 = (float *)((long)local_80 + 2);
      (this->dyn).vsi = (double)(int)sVar4;
    }
    if ((char)bVar2 < '\0') {
      if (pfVar8 < (float *)((long)local_80 + 1U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_001407c2;
        szMsg = "Line too short for next value Squawk";
        ln = 0x251;
        goto LAB_001407a6;
      }
      uVar5 = *(ushort *)local_80;
      local_80 = (float *)((long)local_80 + 2);
      (this->dyn).radar.code = (ulong)uVar5;
    }
    bVar7 = true;
    if (bVar3 == 0) goto LAB_001407c4;
    if (local_80 <= pfVar8) {
      if ((bVar3 & 8) != 0) {
        (this->pos).f =
             (posFlagsTy)
             (((ushort)*(undefined4 *)&(this->pos).f & 0xfcff |
              (ushort)((*(byte *)local_80 & 8) >> 3) << 8) + 0x100);
      }
      goto LAB_001407c4;
    }
    if (3 < (int)dataRefs.iLogLevel) goto LAB_001407c2;
    szMsg = "Line too short for next value Flags";
    ln = 599;
  }
  else {
    if ((float *)((long)local_80 + ((ulong)*(byte *)local_80 - 1)) <= pfVar8) {
      VRSString_abi_cxx11_(&local_48,(uint8_t **)&local_80);
      std::__cxx11::string::operator=((string *)&(this->stat).call,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      goto LAB_0014053d;
    }
    if (3 < (int)dataRefs.iLogLevel) {
LAB_001407c2:
      bVar7 = false;
      goto LAB_001407c4;
    }
    szMsg = "Line too short for next value Call Sign";
    ln = 0x227;
  }
LAB_001407a6:
  bVar7 = false;
  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
         ,ln,"StreamProcessDataVRSLine",logERR,szMsg);
LAB_001407c4:
  std::__cxx11::string::~string((string *)&key.key);
  return bVar7;
}

Assistant:

bool ADSBHubConnection::StreamProcessDataVRSLine (const uint8_t* pStart)
{
    // end of line, based on fact that line length is stored in first byte
    const size_t len = size_t(pStart[0]);
    if (len < 10) {
        LOG_MSG(logDEBUG, "Ignoring too short a message of length %d", int(len));
        return false;
    }
    const uint8_t* const pEnd = pStart + len;
    
    // Skip over length, checksum, transmission type:
    pStart += 4;
    
    // next 3 bytes is the ADS-B hex id
    LTFlightData::FDKeyTy key (LTFlightData::KEY_ICAO,
                               (unsigned long)(pStart[0]) << 16 |
                               (unsigned long)(pStart[1]) <<  8 |
                               (unsigned long)(pStart[2]));
    pStart += 3;

    // Change of plane? Then process previous data first before continuing
    if (fdKey != key) {
        ProcessPlaneData();
        // New plane
        fdKey = key;
    }
    
    // remember list of fields and list of flags
    uint8_t fields = pStart[0];
    uint8_t flags  = pStart[1];
    pStart += 2;
    
    // --- process fields ---
    TEST_END("no fields processed")
    
    // Callsign
    if (fields & 0x01) {
        TEST_LEN(size_t(pStart[0]), "Call Sign");
        stat.call = VRSString(pStart);
    }

    // Altitude
    if (fields & 0x02) {
        TEST_LEN(3, "Altitude");
        pos.SetAltFt((double)VRSFloatInt(pStart));
    }
    
    // Ground Speed
    if (fields & 0x04) {
        TEST_LEN(2, "Ground Speed");
        dyn.spd = (double)VRSFloatShort(pStart);
    }
    
    // Track * 10.0
    if (fields & 0x08) {
        TEST_LEN(2, "Track");
        pos.heading() = dyn.heading = (double)VRSFloatShort(pStart) / 10.0;
    }
    
    // Latitude
    if (fields & 0x10) {
        TEST_LEN(4, "Latitude");
        pos.lat() = (double)VRSFloat(pStart);
    }
    
    // Longitude
    if (fields & 0x20) {
        TEST_LEN(4, "Longitude");
        pos.lon() = (double)VRSFloat(pStart);
    }
    
    // Vertical Speed
    if (fields & 0x40) {
        TEST_LEN(2, "VSI");
        dyn.vsi = (double)VRSFloatShort(pStart);
    }
    
    // Squawk
    if (fields & 0x80) {
        TEST_LEN(2, "Squawk");
        dyn.radar.code = (long)VRSShort(pStart);
    }

    // --- Flags ---
    if (flags) {
        TEST_LEN(1, "Flags");
        // Only one we are interested in is 'On ground'
        if (flags & 0x08) {
            pos.f.onGrnd =
                (pStart[0] & 0x08) ? GND_ON : GND_OFF;
        }
        ++pStart;
    }
    
    return true;
}